

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSPI.cpp
# Opt level: O0

Pass * wasm::createJSPIPass(void)

{
  JSPI *this;
  
  this = (JSPI *)operator_new(0x60);
  *(undefined8 *)
   &(this->super_Pass).passArg.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = 0;
  (this->externref).id = 0;
  *(undefined8 *)
   ((long)&(this->super_Pass).passArg.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload + 0x10) = 0;
  *(undefined8 *)
   ((long)&(this->super_Pass).passArg.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload + 0x18) = 0;
  *(undefined8 *)
   &(this->super_Pass).passArg.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload = 0;
  *(undefined8 *)
   ((long)&(this->super_Pass).passArg.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload + 8) = 0;
  (this->super_Pass).name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this->super_Pass).name.field_2 + 8) = 0;
  *(undefined8 *)&(this->super_Pass).name = 0;
  (this->super_Pass).name._M_string_length = 0;
  (this->super_Pass)._vptr_Pass = (_func_int **)0x0;
  (this->super_Pass).runner = (PassRunner *)0x0;
  JSPI::JSPI(this);
  return &this->super_Pass;
}

Assistant:

Pass* createJSPIPass() { return new JSPI(); }